

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

optional<toml::detail::multiline_spacer<toml::type_config>_> *
toml::detail::skip_multiline_spacer<toml::type_config>
          (location *loc,context<toml::type_config> *ctx,bool newline_found)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  context<toml::type_config> *in_RDX;
  either *in_RDI;
  region tabs;
  region sp;
  region nl;
  string comment;
  region comm;
  bool spacer_found;
  multiline_spacer<toml::type_config> spacer;
  spec *spec;
  multiline_spacer<toml::type_config> *in_stack_fffffffffffffcd8;
  region *in_stack_fffffffffffffce0;
  either *args_1;
  sequence *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  int iVar4;
  undefined4 in_stack_fffffffffffffd04;
  location *in_stack_fffffffffffffd10;
  pointer in_stack_fffffffffffffd18;
  spec *in_stack_fffffffffffffd28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffd38;
  char local_261 [49];
  location *in_stack_fffffffffffffdd0;
  sequence *in_stack_fffffffffffffdd8;
  location *in_stack_fffffffffffffe60;
  repeat_at_least *in_stack_fffffffffffffe68;
  
  args_1 = in_RDI;
  context<toml::type_config>::toml_spec(in_RDX);
  multiline_spacer<toml::type_config>::multiline_spacer
            ((multiline_spacer<toml::type_config> *)0x724b79);
  preserve_comments::clear((preserve_comments *)0x724bad);
  bVar2 = false;
  while (bVar1 = location::eof((location *)in_stack_fffffffffffffce0), ((bVar1 ^ 0xffU) & 1) != 0) {
    syntax::comment((spec *)in_stack_fffffffffffffd38._M_pi);
    syntax::newline(in_stack_fffffffffffffd28);
    sequence::sequence<toml::detail::sequence,toml::detail::either>
              ((sequence *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8,args_1);
    sequence::scan(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    sequence::~sequence((sequence *)in_stack_fffffffffffffce0);
    either::~either((either *)in_stack_fffffffffffffce0);
    sequence::~sequence((sequence *)in_stack_fffffffffffffce0);
    bVar1 = region::operator_cast_to_bool((region *)0x724c6d);
    if (bVar1) {
      region::as_string_abi_cxx11_((region *)in_stack_fffffffffffffd38._M_pi);
      bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x724ca2);
      if ((!bVar2) &&
         (pvVar3 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffce0), *pvVar3 == '\n')) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce0);
        bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x724cdd);
        if ((!bVar2) &&
           (pvVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffce0), *pvVar3 == '\r')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffce0);
        }
      }
      preserve_comments::push_back
                ((preserve_comments *)in_stack_fffffffffffffce0,(string *)in_stack_fffffffffffffcd8)
      ;
      bVar2 = true;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffce0);
LAB_0072512b:
      iVar4 = 0;
    }
    else {
      syntax::newline(in_stack_fffffffffffffd28);
      either::scan((either *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      either::~either((either *)in_stack_fffffffffffffce0);
      bVar1 = region::operator_cast_to_bool((region *)0x724e6a);
      if (bVar1) {
        preserve_comments::clear((preserve_comments *)0x724e89);
        bVar2 = true;
LAB_007250fb:
        iVar4 = 0;
      }
      else {
        local_261[0] = ' ';
        std::bit_cast<unsigned_char,_char>(local_261);
        in_stack_fffffffffffffce0 = (region *)(local_261 + 1);
        character::character
                  ((character *)in_stack_fffffffffffffce0,
                   (char_type)((ulong)in_stack_fffffffffffffcd8 >> 0x38));
        repeat_at_least::repeat_at_least<toml::detail::character>
                  ((repeat_at_least *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                   (size_t)in_stack_fffffffffffffcf8,(character *)args_1);
        repeat_at_least::scan(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
        repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffce0);
        character::~character((character *)0x724f4b);
        bVar1 = region::operator_cast_to_bool((region *)0x724f58);
        if (bVar1) {
          region::length((region *)(local_261 + 0x29));
          bVar2 = true;
LAB_007250da:
          iVar4 = 0;
        }
        else {
          in_stack_fffffffffffffd04 = CONCAT13(9,(int3)in_stack_fffffffffffffd04);
          std::bit_cast<unsigned_char,_char>(&stack0xfffffffffffffd07);
          in_stack_fffffffffffffcd8 =
               (multiline_spacer<toml::type_config> *)&stack0xfffffffffffffd08;
          character::character
                    ((character *)in_stack_fffffffffffffce0,
                     (char_type)((ulong)in_stack_fffffffffffffcd8 >> 0x38));
          repeat_at_least::repeat_at_least<toml::detail::character>
                    ((repeat_at_least *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     (size_t)in_stack_fffffffffffffcf8,(character *)args_1);
          repeat_at_least::scan(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
          repeat_at_least::~repeat_at_least((repeat_at_least *)in_stack_fffffffffffffce0);
          character::~character((character *)0x725032);
          bVar1 = region::operator_cast_to_bool((region *)0x72503c);
          if (bVar1) {
            region::length((region *)&stack0xfffffffffffffd30);
            bVar2 = true;
            iVar4 = 0;
          }
          else {
            iVar4 = 3;
          }
          region::~region(in_stack_fffffffffffffce0);
          if (iVar4 == 0) goto LAB_007250da;
        }
        region::~region(in_stack_fffffffffffffce0);
        if (iVar4 == 0) goto LAB_007250fb;
      }
      region::~region(in_stack_fffffffffffffce0);
      if (iVar4 == 0) goto LAB_0072512b;
    }
    region::~region(in_stack_fffffffffffffce0);
    if (iVar4 != 0) break;
    in_stack_fffffffffffffd00 = 0;
  }
  if (bVar2) {
    std::optional<toml::detail::multiline_spacer<toml::type_config>_>::
    optional<toml::detail::multiline_spacer<toml::type_config>,_true>
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)
               in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  }
  else {
    cxx::make_nullopt();
    std::optional<toml::detail::multiline_spacer<toml::type_config>_>::optional
              ((optional<toml::detail::multiline_spacer<toml::type_config>_> *)in_RDI);
  }
  multiline_spacer<toml::type_config>::~multiline_spacer
            ((multiline_spacer<toml::type_config> *)0x7251aa);
  return (optional<toml::detail::multiline_spacer<toml::type_config>_> *)args_1;
}

Assistant:

cxx::optional<multiline_spacer<TC>>
skip_multiline_spacer(location& loc, context<TC>& ctx, const bool newline_found = false)
{
    const auto& spec = ctx.toml_spec();

    multiline_spacer<TC> spacer;
    spacer.newline_found = newline_found;
    spacer.indent_type   = indent_char::none;
    spacer.indent        = 0;
    spacer.comments.clear();

    bool spacer_found = false;
    while( ! loc.eof())
    {
        if(auto comm = sequence(syntax::comment(spec), syntax::newline(spec)).scan(loc))
        {
            spacer.newline_found = true;
            auto comment = comm.as_string();
            if( ! comment.empty() && comment.back() == '\n')
            {
                comment.pop_back();
                if (!comment.empty() && comment.back() == '\r')
                {
                    comment.pop_back();
                }
            }

            spacer.comments.push_back(std::move(comment));
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto nl = syntax::newline(spec).scan(loc))
        {
            spacer.newline_found = true;
            spacer.comments.clear();
            spacer.indent_type = indent_char::none;
            spacer.indent = 0;
            spacer_found = true;
        }
        else if(auto sp = repeat_at_least(1, character(cxx::bit_cast<location::char_type>(' '))).scan(loc))
        {
            spacer.indent_type = indent_char::space;
            spacer.indent      = static_cast<std::int32_t>(sp.length());
            spacer_found = true;
        }
        else if(auto tabs = repeat_at_least(1, character(cxx::bit_cast<location::char_type>('\t'))).scan(loc))
        {
            spacer.indent_type = indent_char::tab;
            spacer.indent      = static_cast<std::int32_t>(tabs.length());
            spacer_found = true;
        }
        else
        {
            break; // done
        }
    }
    if( ! spacer_found)
    {
        return cxx::make_nullopt();
    }
    return spacer;
}